

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

string * BasePort::DefaultPort_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"fw:0","");
  return in_RDI;
}

Assistant:

std::string BasePort::DefaultPort(void)
{
#if Amp1394_HAS_RAW1394
    return "fw:0";
#elif Amp1394_HAS_EMIO
    return "emio";
#else
    return "udp:" ETH_UDP_DEFAULT_IP;
#endif

}